

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::RunBullseyeCommand
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,char *cmd,char *arg,
          string *outputFile)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  uint uVar4;
  string stdoutFile;
  cmCTestRunProcess runCoverageSrc;
  string program;
  string stderrFile;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  _cmCTestLog_msg = (pointer)0x0;
  cmsys::SystemTools::FindProgram
            (&program,cmd,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cmCTestLog_msg,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&cmCTestLog_msg);
  if (program._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot find :");
    poVar3 = std::operator<<(poVar3,cmd);
    std::operator<<(poVar3,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    uVar4 = 0;
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x792,(char *)CONCAT44(runCoverageSrc._4_4_,runCoverageSrc.PipeState),false);
    std::__cxx11::string::~string((string *)&runCoverageSrc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    if (arg == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Run : ");
      poVar3 = std::operator<<(poVar3,(string *)&program);
      std::operator<<(poVar3,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x79a,(char *)CONCAT44(runCoverageSrc._4_4_,runCoverageSrc.PipeState),
                   (this->super_cmCTestGenericHandler).Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Run : ");
      poVar3 = std::operator<<(poVar3,(string *)&program);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,arg);
      std::operator<<(poVar3,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x797,(char *)CONCAT44(runCoverageSrc._4_4_,runCoverageSrc.PipeState),
                   (this->super_cmCTestGenericHandler).Quiet);
    }
    std::__cxx11::string::~string((string *)&runCoverageSrc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTestRunProcess::cmCTestRunProcess(&runCoverageSrc);
    cmCTestRunProcess::SetCommand(&runCoverageSrc,program._M_dataplus._M_p);
    cmCTestRunProcess::AddArgument(&runCoverageSrc,arg);
    std::operator+(&stdoutFile,&cont->BinaryDir,"/Testing/Temporary/");
    cmCTest::GetCurrentTag_abi_cxx11_
              ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
    std::__cxx11::string::append((string *)&stdoutFile);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::append((char *)&stdoutFile);
    std::__cxx11::string::append((char *)&stdoutFile);
    std::__cxx11::string::string((string *)&stderrFile,(string *)&stdoutFile);
    std::__cxx11::string::append((char *)&stdoutFile);
    std::__cxx11::string::append((char *)&stderrFile);
    cmCTestRunProcess::SetStdoutFile(&runCoverageSrc,stdoutFile._M_dataplus._M_p);
    cmCTestRunProcess::SetStderrFile(&runCoverageSrc,stderrFile._M_dataplus._M_p);
    bVar2 = cmCTestRunProcess::StartProcess(&runCoverageSrc);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Could not run : ");
      poVar3 = std::operator<<(poVar3,(string *)&program);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,arg);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"kwsys process state : ");
      std::ostream::operator<<(poVar3,runCoverageSrc.PipeState);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x7ad,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else {
      runCoverageSrc.PipeState = cmsysProcess_WaitForExit(runCoverageSrc.Process,(double *)0x0);
      std::__cxx11::string::_M_assign((string *)outputFile);
    }
    uVar4 = (uint)bVar2;
    std::__cxx11::string::~string((string *)&stderrFile);
    std::__cxx11::string::~string((string *)&stdoutFile);
    cmCTestRunProcess::~cmCTestRunProcess(&runCoverageSrc);
  }
  std::__cxx11::string::~string((string *)&program);
  return uVar4;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCommand(
  cmCTestCoverageHandlerContainer* cont, const char* cmd, const char* arg,
  std::string& outputFile)
{
  std::string program = cmSystemTools::FindProgram(cmd);
  if (program.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find :" << cmd << "\n");
    return 0;
  }
  if (arg) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << " " << arg << "\n", this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << "\n", this->Quiet);
  }
  // create a process object and start it
  cmCTestRunProcess runCoverageSrc;
  runCoverageSrc.SetCommand(program.c_str());
  runCoverageSrc.AddArgument(arg);
  std::string stdoutFile = cont->BinaryDir + "/Testing/Temporary/";
  stdoutFile += this->GetCTestInstance()->GetCurrentTag();
  stdoutFile += "-";
  stdoutFile += cmd;
  std::string stderrFile = stdoutFile;
  stdoutFile += ".stdout";
  stderrFile += ".stderr";
  runCoverageSrc.SetStdoutFile(stdoutFile.c_str());
  runCoverageSrc.SetStderrFile(stderrFile.c_str());
  if (!runCoverageSrc.StartProcess()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not run : " << program << " " << arg << "\n"
                                  << "kwsys process state : "
                                  << runCoverageSrc.GetProcessState());
    return 0;
  }
  // since we set the output file names wait for it to end
  runCoverageSrc.WaitForExit();
  outputFile = stdoutFile;
  return 1;
}